

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.h
# Opt level: O0

const_iterator __thiscall QAssociativeIterable::constBegin(QAssociativeIterable *this)

{
  long lVar1;
  void *extraout_RDX;
  QTaggedIterator<QAssociativeConstIterator,_void> *in_RSI;
  QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_> in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar2;
  QConstIterator<QMetaAssociation> *in_stack_ffffffffffffff98;
  QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
  this_00;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffffb8;
  QAssociativeConstIterator *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI.m_pointer.d;
  QIterable<QMetaAssociation>::constBegin(in_stack_ffffffffffffffb8);
  QAssociativeConstIterator::QAssociativeConstIterator
            ((QAssociativeConstIterator *)this_00.d,in_stack_ffffffffffffff98);
  QTaggedIterator<QAssociativeConstIterator,_void>::QTaggedIterator
            (in_RSI,in_stack_ffffffffffffffc0);
  QAssociativeConstIterator::~QAssociativeConstIterator((QAssociativeConstIterator *)0x3c244d);
  QConstIterator<QMetaAssociation>::~QConstIterator((QConstIterator<QMetaAssociation> *)0x3c2457);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterator = extraout_RDX;
    cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d = in_RDI.m_pointer.d;
    return (const_iterator)
           cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
           super_QBaseIterator<QMetaAssociation>;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constBegin() const { return const_iterator(QIterable::constBegin()); }